

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

QUrl __thiscall QTextBrowserPrivate::resolveUrl(QTextBrowserPrivate *this,QUrl *url)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  QString *in_RDX;
  QUrlPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  QFileInfo fi;
  undefined4 in_stack_fffffffffffffeb8;
  ComponentFormattingOption in_stack_fffffffffffffebc;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  QString *in_stack_fffffffffffffec8;
  bool local_12a;
  bool local_129;
  QUrl local_b8;
  undefined1 local_b0 [24];
  undefined1 *local_98 [2];
  undefined1 local_88 [24];
  undefined1 local_70 [24];
  QFileInfo local_58 [8];
  QLatin1StringView local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = QUrl::isRelative();
  if ((uVar6 & 1) == 0) {
    QUrl::QUrl((QUrl *)in_RDI,(QUrl *)in_RDX);
    goto LAB_006dcc49;
  }
  uVar6 = QUrl::isRelative();
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  bVar7 = false;
  if ((uVar6 & 1) == 0) {
    QUrl::scheme();
    bVar3 = true;
    local_50 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffec8,
                          CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    bVar4 = ::operator==(in_stack_fffffffffffffec8,
                         (QLatin1StringView *)
                         CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    local_129 = true;
    if (bVar4) {
      QUrl::toLocalFile();
      bVar2 = true;
      QFileInfo::QFileInfo(local_58,(QString *)local_70);
      bVar1 = true;
      bVar4 = QFileInfo::isAbsolute((QFileInfo *)0x6dca1c);
      local_129 = true;
      if (!bVar4) goto LAB_006dca29;
    }
  }
  else {
LAB_006dca29:
    uVar5 = QUrl::hasFragment();
    bVar7 = (uVar5 & 1) != 0;
    local_12a = false;
    if (bVar7) {
      in_stack_fffffffffffffec8 = in_RDX;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
      QUrl::path((QFlags_conflict1 *)local_88);
      local_12a = QString::isEmpty((QString *)0x6dca89);
    }
    local_129 = local_12a;
  }
  if (bVar7) {
    QString::~QString((QString *)0x6dcab3);
  }
  if (bVar1) {
    QFileInfo::~QFileInfo(local_58);
  }
  if (bVar2) {
    QString::~QString((QString *)0x6dcadf);
  }
  if (bVar3) {
    QString::~QString((QString *)0x6dcaf5);
  }
  if ((local_129 & 1U) == 0) {
    local_98[0] = &DAT_aaaaaaaaaaaaaaaa;
    QUrl::toLocalFile();
    QFileInfo::QFileInfo((QFileInfo *)local_98,(QString *)local_b0);
    QString::~QString((QString *)0x6dcb69);
    uVar6 = QFileInfo::exists();
    if ((uVar6 & 1) == 0) {
      QUrl::QUrl((QUrl *)in_RDI,(QUrl *)in_RDX);
    }
    else {
      QFileInfo::absolutePath();
      QDir::separator();
      ::operator+(in_stack_fffffffffffffec8,(QChar *)CONCAT17(local_129,in_stack_fffffffffffffec0));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString,_QChar> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      QUrl::fromLocalFile((QString *)&local_b8);
      QUrl::resolved((QUrl *)in_RDI);
      QUrl::~QUrl(&local_b8);
      QString::~QString((QString *)0x6dcc04);
      QStringBuilder<QString,_QChar>::~QStringBuilder((QStringBuilder<QString,_QChar> *)0x6dcc11);
      QString::~QString((QString *)0x6dcc1b);
    }
    QFileInfo::~QFileInfo((QFileInfo *)local_98);
  }
  else {
    QUrl::resolved((QUrl *)in_RDI);
  }
LAB_006dcc49:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QUrl)in_RDI;
}

Assistant:

QUrl QTextBrowserPrivate::resolveUrl(const QUrl &url) const
{
    if (!url.isRelative())
        return url;

    // For the second case QUrl can merge "#someanchor" with "foo.html"
    // correctly to "foo.html#someanchor"
    if (!(currentURL.isRelative()
          || (currentURL.scheme() == "file"_L1
              && !QFileInfo(currentURL.toLocalFile()).isAbsolute()))
          || (url.hasFragment() && url.path().isEmpty())) {
        return currentURL.resolved(url);
    }

    // this is our last resort when current url and new url are both relative
    // we try to resolve against the current working directory in the local
    // file system.
    QFileInfo fi(currentURL.toLocalFile());
    if (fi.exists()) {
        return QUrl::fromLocalFile(fi.absolutePath() + QDir::separator()).resolved(url);
    }

    return url;
}